

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::BeginQuery(DeviceContextVkImpl *this,IQuery *pQuery)

{
  QUERY_TYPE QueryType;
  uint32_t query;
  VkQueryPool queryPool;
  QueryVkImpl *pQVar1;
  uint queryFlag;
  string msg;
  char *local_30;
  char (*Args_2) [115];
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BeginQuery
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pQuery,0);
  if (this->m_pQueryMgr == (QueryManagerVk *)0x0) {
    if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false) {
      FormatString<char[80]>
                (&msg,(char (*) [80])
                      "Query manager should never be null for immediate contexts. This might be a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb47);
      std::__cxx11::string::~string((string *)&msg);
      if (this->m_pQueryMgr != (QueryManagerVk *)0x0) goto LAB_0027a5ae;
    }
    FormatString<char[94]>
              (&msg,(char (*) [94])
                    "Query manager is null, which indicates that this deferred context is not in a recording state"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb48);
    std::__cxx11::string::~string((string *)&msg);
  }
LAB_0027a5ae:
  pQVar1 = ClassPtrCast<Diligent::QueryVkImpl,Diligent::IQuery>(pQuery);
  QueryType = (pQVar1->super_QueryBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
              .m_Desc.Type;
  query = *(uint32_t *)&(pQVar1->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44;
  queryPool = (this->m_pQueryMgr->m_Pools)._M_elems[QueryType].m_vkQueryPool.m_VkObject;
  if (queryPool == (VkQueryPool)0x0) {
    FormatString<char[45]>(&msg,(char (*) [45])"Query pool is not initialized for query type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb4f);
    std::__cxx11::string::~string((string *)&msg);
  }
  EnsureVkCmdBuffer(this);
  if (QueryType == QUERY_TYPE_DURATION) {
    VulkanUtilities::VulkanCommandBuffer::WriteTimestamp
              (&this->m_CommandBuffer,VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT,queryPool,query);
  }
  else {
    if (QueryType == QUERY_TYPE_TIMESTAMP) {
      FormatString<char[47]>(&msg,(char (*) [47])"BeginQuery() is disabled for timestamp queries");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
    }
    else {
      queryFlag = 1 << ((byte)QueryType & 0x1f);
      Args_2 = (char (*) [115])(ulong)queryFlag;
      if ((((this->m_CommandBuffer).m_State.OutsidePassQueries |
           (this->m_CommandBuffer).m_State.InsidePassQueries) >> (QueryType & 0x1f) & 1) == 0) {
        this->m_ActiveQueriesCounter = this->m_ActiveQueriesCounter + 1;
        VulkanUtilities::VulkanCommandBuffer::BeginQuery
                  (&this->m_CommandBuffer,queryPool,query,(uint)(QueryType == QUERY_TYPE_OCCLUSION),
                   queryFlag);
        return;
      }
      local_30 = GetQueryTypeString(QueryType);
      FormatString<char[23],char_const*,char[115]>
                (&msg,(Diligent *)"Another query of type ",(char (*) [23])&local_30,
                 (char **)
                 " is currently active. Overlapping queries do not work in Vulkan. End the first query before beginning another one."
                 ,Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BeginQuery(IQuery* pQuery)
{
    TDeviceContextBase::BeginQuery(pQuery, 0);

    VERIFY(m_pQueryMgr != nullptr || IsDeferred(), "Query manager should never be null for immediate contexts. This might be a bug.");
    DEV_CHECK_ERR(m_pQueryMgr != nullptr, "Query manager is null, which indicates that this deferred context is not in a recording state");

    QueryVkImpl*     pQueryVkImpl = ClassPtrCast<QueryVkImpl>(pQuery);
    const QUERY_TYPE QueryType    = pQueryVkImpl->GetDesc().Type;
    VkQueryPool      vkQueryPool  = m_pQueryMgr->GetQueryPool(QueryType);
    Uint32           Idx          = pQueryVkImpl->GetQueryPoolIndex(0);

    VERIFY(vkQueryPool != VK_NULL_HANDLE, "Query pool is not initialized for query type");

    EnsureVkCmdBuffer();
    if (QueryType == QUERY_TYPE_TIMESTAMP)
    {
        LOG_ERROR_MESSAGE("BeginQuery() is disabled for timestamp queries");
    }
    else if (QueryType == QUERY_TYPE_DURATION)
    {
        m_CommandBuffer.WriteTimestamp(VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, vkQueryPool, Idx);
    }
    else
    {
        const VulkanUtilities::VulkanCommandBuffer::StateCache& CmdBuffState = m_CommandBuffer.GetState();
        if ((CmdBuffState.InsidePassQueries | CmdBuffState.OutsidePassQueries) & (1u << QueryType))
        {
            LOG_ERROR_MESSAGE("Another query of type ", GetQueryTypeString(QueryType),
                              " is currently active. Overlapping queries do not work in Vulkan. "
                              "End the first query before beginning another one.");
            return;
        }

        // A query must either begin and end inside the same subpass of a render pass instance, or must
        // both begin and end outside of a render pass instance (i.e. contain entire render pass instances).

        ++m_ActiveQueriesCounter;
        m_CommandBuffer.BeginQuery(vkQueryPool,
                                   Idx,
                                   // If flags does not contain VK_QUERY_CONTROL_PRECISE_BIT an implementation
                                   // may generate any non-zero result value for the query if the count of
                                   // passing samples is non-zero.
                                   QueryType == QUERY_TYPE_OCCLUSION ? VK_QUERY_CONTROL_PRECISE_BIT : 0,
                                   1u << QueryType);
    }
}